

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::int_writer<char,_fmt::v5::basic_format_specs<char>_>::on_num
          (int_writer<char,_fmt::v5::basic_format_specs<char>_> *this)

{
  num_writer f;
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  string_view prefix;
  undefined4 local_28;
  
  uVar3 = this->abs_value;
  uVar2 = uVar3 | 1;
  uVar4 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar4 = (uVar4 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  cVar1 = internal::thousands_sep_impl<char>((locale_ref)(this->writer->locale_).locale_);
  iVar5 = uVar4 - (uVar3 < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                    (ulong)uVar4 * 4));
  uVar3 = iVar5 * 0x56;
  iVar5 = iVar5 + (uint)(byte)((char)((uVar3 & 0xffff) >> 0xf) + (char)(uVar3 >> 8)) + 1;
  local_28 = CONCAT31(local_28._1_3_,cVar1);
  f.size = iVar5;
  f.abs_value = this->abs_value;
  f._8_4_ = local_28;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
  ::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
              *)this->writer,iVar5,prefix,this->spec,f);
  return;
}

Assistant:

void on_num() {
      int num_digits = internal::count_digits(abs_value);
      char_type sep = internal::thousands_sep<char_type>(writer.locale_);
      int size = num_digits + SEP_SIZE * ((num_digits - 1) / 3);
      writer.write_int(size, get_prefix(), spec,
                       num_writer{abs_value, size, sep});
    }